

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O2

void __thiscall llvm::Triple::getiOSVersion(Triple *this,uint *Major,uint *Minor,uint *Micro)

{
  OSType OVar1;
  
  OVar1 = this->OS;
  if (OVar1 == Darwin) {
LAB_00159c0c:
    *Major = 5;
    *Minor = 0;
    *Micro = 0;
  }
  else {
    if (OVar1 != IOS) {
      if (OVar1 == MacOSX) goto LAB_00159c0c;
      if (OVar1 != TvOS) {
        if (OVar1 == WatchOS) {
          llvm_unreachable_internal
                    ("conflicting triple info",
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
                     ,0x441);
        }
        llvm_unreachable_internal
                  ("unexpected OS for Darwin triple",
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
                   ,0x42e);
      }
    }
    getOSVersion(this,Major,Minor,Micro);
    if (*Major == 0) {
      *Major = (uint)(this->Arch == aarch64) * 2 + 5;
    }
  }
  return;
}

Assistant:

void Triple::getiOSVersion(unsigned &Major, unsigned &Minor,
                           unsigned &Micro) const {
  switch (getOS()) {
  default: llvm_unreachable("unexpected OS for Darwin triple");
  case Darwin:
  case MacOSX:
    // Ignore the version from the triple.  This is only handled because the
    // the clang driver combines OS X and IOS support into a common Darwin
    // toolchain that wants to know the iOS version number even when targeting
    // OS X.
    Major = 5;
    Minor = 0;
    Micro = 0;
    break;
  case IOS:
  case TvOS:
    getOSVersion(Major, Minor, Micro);
    // Default to 5.0 (or 7.0 for arm64).
    if (Major == 0)
      Major = (getArch() == aarch64) ? 7 : 5;
    break;
  case WatchOS:
    llvm_unreachable("conflicting triple info");
  }
}